

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-optimizer.hxx
# Opt level: O2

size_t __thiscall
lineage::heuristics::
PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
::improveBipartition
          (PartitionOptimizerBase<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>_>
           *this,size_t partitionIdA,size_t partitionIdB)

{
  PartitionGraph *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht_00;
  pointer puVar1;
  _Hash_node_base vertex0;
  _Hash_node_base vertex1;
  size_type __n;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  pointer ppVar5;
  __node_base _Var6;
  ostream *poVar7;
  runtime_error *this_02;
  __node_base *p_Var8;
  __node_base *p_Var9;
  ulong uVar10;
  long *plVar11;
  pointer ppVar12;
  __node_base *p_Var13;
  unsigned_long *v_1;
  size_t *psVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  pair<bool,_unsigned_long> pVar19;
  reference rVar20;
  value_type *__range3;
  value_type *__range2;
  ulong local_1a8;
  double local_188;
  double local_180;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  move_edges;
  Move move;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_120;
  double local_e8;
  double local_e0;
  size_t local_d8;
  size_t local_d0;
  vector<bool,_std::allocator<bool>_> *local_c8;
  __node_base *local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  unsigned_long v;
  double local_78;
  double dStack_70;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  partition;
  
  (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])();
  local_78 = this->internalObjective_;
  dStack_70 = this->branchingObjective_;
  this_00 = &this->partitionGraph_;
  puVar1 = (this->partitionGraph_).partitions_.
           super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __ht = &puVar1[partitionIdA]._M_h;
  __ht_00 = &puVar1[partitionIdB]._M_h;
  move_edges.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  move_edges.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  move_edges.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var8 = &puVar1[partitionIdA]._M_h._M_before_begin;
  local_c0 = &puVar1[partitionIdB]._M_h._M_before_begin;
  p_Var9 = p_Var8;
  while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
    vertex0._M_nxt = p_Var9[1]._M_nxt;
    p_Var13 = local_c0;
    while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
      vertex1._M_nxt = p_Var13[1]._M_nxt;
      pVar19 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                         (&((this->super_HeuristicBase).data_)->problemGraph->graph_,
                          (size_t)vertex0._M_nxt,(size_t)vertex1._M_nxt);
      if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        move.vertex_ = (size_t)vertex0._M_nxt;
        move.other_ = (size_t)vertex1._M_nxt;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&move_edges,(pair<unsigned_long,_unsigned_long> *)&move);
        move.vertex_ = (size_t)vertex1._M_nxt;
        move.other_ = (size_t)vertex0._M_nxt;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&move_edges,(pair<unsigned_long,_unsigned_long> *)&move);
      }
    }
  }
  if (move_edges.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      move_edges.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar18 = 0;
  }
  else {
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&move,__ht);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_Hashtable(&local_120,__ht_00);
    for (lVar15 = 0; lVar15 != 0x70; lVar15 = lVar15 + 0x38) {
      plVar11 = (long *)((long)&move.localBranchingObj_ + lVar15);
      while (plVar11 = (long *)*plVar11, plVar11 != (long *)0x0) {
        rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->swapped_,plVar11[1]);
        *rVar20._M_p = *rVar20._M_p & ~rVar20._M_mask;
      }
    }
    lVar15 = 0x38;
    do {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)((long)&move.vertex_ + lVar15));
      lVar15 = lVar15 + -0x38;
    } while (lVar15 != -0x38);
    local_c8 = &this->swapped_;
    (*(this->super_HeuristicBase)._vptr_HeuristicBase[4])(this,partitionIdA,partitionIdB);
    this->localBranchingObjective_ = extraout_XMM0_Qa_00;
    this_01 = &this->visited_;
    uVar16 = (__ht_00->_M_element_count + __ht->_M_element_count >> 1) + 1;
    local_1a8 = 0;
    uVar10 = 0;
    local_188 = extraout_XMM0_Qa;
    while (uVar17 = uVar16, local_1a8 != uVar16) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&move,__ht);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&local_120,__ht_00);
      for (lVar15 = 0; lVar15 != 0x70; lVar15 = lVar15 + 0x38) {
        plVar11 = (long *)((long)&move.localBranchingObj_ + lVar15);
        while (plVar11 = (long *)*plVar11, plVar11 != (long *)0x0) {
          rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,plVar11[1]);
          *rVar20._M_p = *rVar20._M_p & ~rVar20._M_mask;
        }
      }
      lVar15 = 0x38;
      do {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)((long)&move.vertex_ + lVar15));
        ppVar5 = move_edges.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar15 = lVar15 + -0x38;
      } while (lVar15 != -0x38);
      local_e0 = INFINITY;
      local_e8 = INFINITY;
      local_180 = INFINITY;
      local_d8 = 0;
      local_d0 = 0;
      for (ppVar12 = move_edges.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; sVar18 = local_d0, ppVar12 != ppVar5
          ; ppVar12 = ppVar12 + 1) {
        __n = ppVar12->first;
        sVar18 = ppVar12->second;
        puVar2 = (this->partitionGraph_).vertexLabels_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (puVar2[__n] == puVar2[sVar18]) {
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          poVar7 = std::operator<<(poVar7,"(");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,")");
          std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          poVar7 = std::operator<<(poVar7,"(");
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          poVar7 = std::operator<<(poVar7,")");
          std::endl<char,std::char_traits<char>>(poVar7);
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_02,"vertexLabels_ and partitions_ are inconsistent!");
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](local_c8,__n);
        if (((*rVar20._M_p & rVar20._M_mask) == 0) &&
           (rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n),
           (*rVar20._M_p & rVar20._M_mask) == 0)) {
          rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,__n);
          *rVar20._M_p = *rVar20._M_p | rVar20._M_mask;
          if ((1 < (this->partitionGraph_).partitions_.
                   super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [(this->partitionGraph_).vertexLabels_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[__n]]._M_h._M_element_count) &&
             (proposeSingleMove(&move,this,__n,sVar18), move.obj_ < local_180 + -1e-08)) {
            local_d0 = move.vertex_;
            local_d8 = move.other_;
            local_e0 = move.localBranchingObj_;
            local_e8 = move.branchingObj_;
            local_180 = move.obj_;
          }
        }
      }
      uVar17 = local_1a8;
      if (ABS(local_180) == INFINITY) break;
      applySingleMove(this,local_d0,
                      (this->partitionGraph_).vertexLabels_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[local_d8]);
      this->localBranchingObjective_ = local_e0;
      this->branchingObjective_ = local_e8;
      rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](local_c8,sVar18);
      *rVar20._M_p = *rVar20._M_p | rVar20._M_mask;
      (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
      local_1a8 = local_1a8 + 1;
      if (extraout_XMM0_Qa_01 < local_188 + -1e-08) {
        (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
        local_78 = this->internalObjective_;
        dStack_70 = this->branchingObjective_;
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&move,__ht);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable(&local_120,__ht_00);
        for (lVar15 = 0; lVar15 != 0x70; lVar15 = lVar15 + 0x38) {
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable(&partition._M_h,
                       (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)&move.vertex_ + lVar15));
          puVar2 = (this->partitionGraph_).vertexLabels_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (this->bestVertexLabels_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (_Var6 = partition._M_h._M_before_begin; _Var6._M_nxt != (_Hash_node_base *)0x0;
              _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
            puVar3[(long)_Var6._M_nxt[1]._M_nxt] = puVar2[(long)_Var6._M_nxt[1]._M_nxt];
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&partition._M_h);
        }
        lVar15 = 0x38;
        do {
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&move.vertex_ + lVar15));
          lVar15 = lVar15 + -0x38;
          uVar10 = local_1a8;
          local_188 = extraout_XMM0_Qa_02;
        } while (lVar15 != -0x38);
      }
      p_Var9 = p_Var8;
      if (move_edges.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          move_edges.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        move_edges.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             move_edges.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      while (p_Var9 = p_Var9->_M_nxt, p_Var13 = local_c0, p_Var9 != (__node_base *)0x0) {
        while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
          pVar19 = andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::findEdge
                             (&((this->super_HeuristicBase).data_)->problemGraph->graph_,
                              (size_t)p_Var9[1]._M_nxt,(size_t)p_Var13[1]._M_nxt);
          if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            move.vertex_ = *(size_t *)(p_Var9 + 1);
            move.other_ = *(size_t *)(p_Var13 + 1);
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&move_edges,(pair<unsigned_long,_unsigned_long> *)&move);
            move.vertex_ = *(size_t *)(p_Var13 + 1);
            move.other_ = *(size_t *)(p_Var9 + 1);
            std::
            vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
            ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                      ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                        *)&move_edges,(pair<unsigned_long,_unsigned_long> *)&move);
          }
        }
      }
    }
    applyMerge(this,partitionIdA,partitionIdB);
    (*(this->super_HeuristicBase)._vptr_HeuristicBase[2])(this);
    sVar18 = uVar17 + 1;
    if (local_188 + -1e-08 <= extraout_XMM0_Qa_03) {
      bVar4 = uVar10 < sVar18;
      sVar18 = uVar10;
      if (bVar4) {
        buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (&buffer,__ht_00->_M_element_count + __ht->_M_element_count);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&move,__ht);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable(&local_120,__ht_00);
        for (lVar15 = 0; lVar15 != 0x70; lVar15 = lVar15 + 0x38) {
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_Hashtable(&partition._M_h,
                       (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)((long)&move.vertex_ + lVar15));
          p_Var9 = &partition._M_h._M_before_begin;
          while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
            v = *(unsigned_long *)(p_Var9 + 1);
            if ((this->bestVertexLabels_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[v] !=
                (this->partitionGraph_).vertexLabels_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[v]) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&buffer,&v);
            }
          }
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&partition._M_h);
        }
        lVar15 = 0x38;
        do {
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&move.vertex_ + lVar15));
          puVar2 = buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar15 = lVar15 + -0x38;
          psVar14 = buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start;
        } while (lVar15 != -0x38);
        for (; psVar14 != puVar2; psVar14 = psVar14 + 1) {
          PartitionGraph::forceMove
                    (this_00,*psVar14,
                     (this->bestVertexLabels_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[*psVar14]);
        }
        PartitionGraph::updateEdgesOfPartition(this_00,partitionIdA);
        PartitionGraph::updateEdgesOfPartition(this_00,partitionIdB);
        this->internalObjective_ = local_78;
        this->branchingObjective_ = dStack_70;
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&buffer.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      }
    }
    else {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)&move,__ht);
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_Hashtable(&local_120,__ht_00);
      for (lVar15 = 0; lVar15 != 0x70; lVar15 = lVar15 + 0x38) {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_Hashtable(&partition._M_h,
                     (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)((long)&move.vertex_ + lVar15));
        puVar2 = (this->partitionGraph_).vertexLabels_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (this->bestVertexLabels_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (_Var6 = partition._M_h._M_before_begin; _Var6._M_nxt != (_Hash_node_base *)0x0;
            _Var6._M_nxt = (_Var6._M_nxt)->_M_nxt) {
          puVar3[(long)_Var6._M_nxt[1]._M_nxt] = puVar2[(long)_Var6._M_nxt[1]._M_nxt];
        }
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&partition._M_h);
      }
      lVar15 = 0x38;
      do {
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)((long)&move.vertex_ + lVar15));
        lVar15 = lVar15 + -0x38;
      } while (lVar15 != -0x38);
    }
  }
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&move_edges.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  return sVar18;
}

Assistant:

inline size_t
PartitionOptimizerBase<BROPT>::improveBipartition(size_t partitionIdA,
                                                  size_t partitionIdB)
{
    size_t numberOfMoves = 0;

    size_t bestNumberOfMoves = 0;
    auto bestObjective = getObjective();
    auto bestInternalObjective = internalObjective_;
    auto bestBranchingObjective = branchingObjective_;

    auto& partitionA = partitionGraph_.partitions_[partitionIdA];
    auto& partitionB = partitionGraph_.partitions_[partitionIdB];

    // find moves.
    std::vector<std::pair<size_t, size_t>> move_edges;
    for (const auto v : partitionA) {
        for (const auto w : partitionB) {

            if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                move_edges.emplace_back(std::make_pair(v, w));
                move_edges.emplace_back(std::make_pair(w, v));
            }
        }
    }

    if (move_edges.empty()) {
        return 0;
    }

    // mark nodes as available for swapping.
    for (const auto& partition : { partitionA, partitionB }) {
        for (const auto& v : partition) {
            swapped_[v] = false;
        }
    }

    // start greedy search for improving moves
    localBranchingObjective_ =
        getBaselineBranchingObjective(partitionIdA, partitionIdB);

    const size_t maxMoves =
        calcMaximumMoves(partitionA.size(), partitionB.size());
    for (size_t iter = 0; iter < maxMoves + 1; ++iter) {

        Move best;

        // reset visits.
        for (const auto& partition : { partitionA, partitionB }) {
            for (const auto& v : partition) {
                visited_[v] = false;
            }
        }

        for (const auto& vw : move_edges) {

            const auto v = vw.first;
            const auto w = vw.second;

            // /* Debug
            if (partitionGraph_.vertexLabels_[v] ==
                partitionGraph_.vertexLabels_[w]) {
                std::cerr << v << "(" << partitionGraph_.vertexLabels_[v] << ")"
                          << std::endl;
                std::cerr << w << "(" << partitionGraph_.vertexLabels_[w] << ")"
                          << std::endl;
                throw std::runtime_error(
                    "vertexLabels_ and partitions_ are inconsistent!");
            }
            // */

            // prevent swapping back and forth
            if (swapped_[v] || visited_[v]) {
                continue;
            }
            visited_[v] = true;

            // dont let partitions vanish.
            // This case is handled by a complete merge.
            if (partitionGraph_.partitions_[partitionGraph_.vertexLabels_[v]]
                    .size() <= 1) {
                continue;
            }

            const auto move = proposeSingleMove(v, w);
            if (lowerThanWithEpsilon(best.obj_, move.obj_)) {
                best = move;
            }
        }

        // if no move was feasible, then stop searching for moves.
        if (std::isinf(best.obj_)) {
            break;

        } else {
            applySingleMove(best.vertex_,
                            partitionGraph_.vertexLabels_[best.other_]);
            localBranchingObjective_ = best.localBranchingObj_;
            branchingObjective_ = best.branchingObj_;
            swapped_[best.vertex_] = true;
            ++numberOfMoves;

            // keep track of the best labeling.
            if (lowerThanWithEpsilon(bestObjective, getObjective())) {

                bestObjective = getObjective();
                bestNumberOfMoves = numberOfMoves;
                bestInternalObjective = internalObjective_;
                bestBranchingObjective = branchingObjective_;

                // update best vertex labeling.
                for (auto partition : { partitionA, partitionB }) {
                    for (auto v : partition) {
                        bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                    }
                }
            }
        }

        // search new feasible moves.
        move_edges.clear();
        for (const auto& v : partitionA) {
            for (const auto& w : partitionB) {

                if (this->data_.problemGraph.graph().findEdge(v, w).first) {
                    move_edges.emplace_back(std::make_pair(v, w));
                    move_edges.emplace_back(std::make_pair(w, v));
                }
            }
        }
    }

    // Would a merge be better?
    {
        applyMerge(partitionIdA, partitionIdB);
        ++numberOfMoves;

        if (lowerThanWithEpsilon(bestObjective, getObjective())) {

            bestNumberOfMoves = numberOfMoves;

            // update best vertex labeling.
            for (auto partition : { partitionA, partitionB }) {
                for (auto v : partition) {
                    bestVertexLabels_[v] = partitionGraph_.vertexLabels_[v];
                }
            }
        }
    }

    // revert to best labeling.
    if (numberOfMoves > bestNumberOfMoves) {

        std::vector<size_t> buffer;
        buffer.reserve(partitionA.size() + partitionB.size());

        for (auto partition : { partitionA, partitionB }) {
            for (auto v : partition) {
                if (bestVertexLabels_[v] != partitionGraph_.vertexLabels_[v]) {
                    buffer.push_back(v);
                }
            }
        }

        // revert partitions and labels.
        for (const auto& v : buffer) {
            partitionGraph_.forceMove(v, bestVertexLabels_[v]);
        }

        // update branching edges.
        partitionGraph_.updateEdgesOfPartition(partitionIdA);
        partitionGraph_.updateEdgesOfPartition(partitionIdB);

        // and revert partial objectives.
        internalObjective_ = bestInternalObjective;
        branchingObjective_ = bestBranchingObjective;
    }

    // assert(std::abs(getObjective() - bestObjective) < EPSILON);

    return bestNumberOfMoves;
}